

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altrace_record.c
# Opt level: O1

BufferWrapper * buffer_wrapped_lookup(ALuint name)

{
  DeviceWrapper *pDVar1;
  BufferWrapper *pBVar2;
  
  if (current_context == (ContextWrapper *)0x0) {
    pDVar1 = (DeviceWrapper *)0x0;
  }
  else {
    pDVar1 = current_context->device;
  }
  if (name == 0 || pDVar1 == (DeviceWrapper *)0x0) {
    pBVar2 = (BufferWrapper *)0x0;
  }
  else {
    for (pBVar2 = pDVar1->wrapped_buffer_hash[name & 0xff];
        (pBVar2 != (BufferWrapper *)0x0 && (pBVar2->name != name)); pBVar2 = pBVar2->hash_next) {
    }
  }
  return pBVar2;
}

Assistant:

static BufferWrapper *buffer_wrapped_lookup(const ALuint name)
{
    BufferWrapper *retval = NULL;
    DeviceWrapper *device = current_context ? current_context->device : NULL;
    if (device && name) {
        const uint8 hash = hash_alname(name);
        for (retval = device->wrapped_buffer_hash[hash]; retval; retval = retval->hash_next) {
            if (retval->name == name) {
                break;
            }
        }
    }
    return retval;


}